

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreFree(Gia_ManAre_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Vec_t *pVVar2;
  void *pvVar3;
  long lVar4;
  
  Gia_ManStop(p->pAig);
  if (p->pNew != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pNew);
  }
  pVVar1 = p->vCubesA;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCubesB;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vCiTfos;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar4];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar2->nSize);
  }
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Vec_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCiLits;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar4];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar2->nSize);
  }
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Vec_t *)0x0) {
    free(pVVar2);
  }
  if (0 < p->nObjPages) {
    lVar4 = 0;
    do {
      if (p->ppObjs[lVar4] != (uint *)0x0) {
        free(p->ppObjs[lVar4]);
        p->ppObjs[lVar4] = (uint *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nObjPages);
  }
  if (p->ppObjs != (uint **)0x0) {
    free(p->ppObjs);
    p->ppObjs = (uint **)0x0;
  }
  if (0 < p->nStaPages) {
    lVar4 = 0;
    do {
      if (p->ppStas[lVar4] != (uint *)0x0) {
        free(p->ppStas[lVar4]);
        p->ppStas[lVar4] = (uint *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nStaPages);
  }
  if (p->ppStas != (uint **)0x0) {
    free(p->ppStas);
    p->ppStas = (uint **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Gia_ManAreFree( Gia_ManAre_t * p )
{
    int i;
    Gia_ManStop( p->pAig );
    if ( p->pNew )
        Gia_ManStop( p->pNew );
    Vec_IntFree( p->vCubesA );
    Vec_IntFree( p->vCubesB );
    Vec_VecFree( p->vCiTfos );
    Vec_VecFree( p->vCiLits );
    for ( i = 0; i < p->nObjPages; i++ )
        ABC_FREE( p->ppObjs[i] );
    ABC_FREE( p->ppObjs );
    for ( i = 0; i < p->nStaPages; i++ )
        ABC_FREE( p->ppStas[i] );
    ABC_FREE( p->ppStas );
//    ABC_FREE( p->pfUseless );
    ABC_FREE( p );
}